

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O0

void __thiscall Linker::CleanCode(Linker *this)

{
  undefined *puVar1;
  uint uVar2;
  RegVmCmd **ppRVar3;
  uint **ppuVar4;
  uint local_18;
  uint local_14;
  uint i_1;
  uint i;
  Linker *this_local;
  
  FastVector<ExternTypeInfo,_false,_false>::clear(&this->exTypes);
  FastVector<ExternMemberInfo,_false,_false>::clear(&this->exTypeExtra);
  FastVector<ExternConstantInfo,_false,_false>::clear(&this->exTypeConstants);
  FastVector<ExternVarInfo,_false,_false>::clear(&this->exVariables);
  FastVector<ExternFuncInfo,_false,_false>::clear(&this->exFunctions);
  FastVector<unsigned_int,_false,_false>::clear(&this->exFunctionExplicitTypeArrayOffsets);
  FastVector<unsigned_int,_false,_false>::clear(&this->exFunctionExplicitTypes);
  FastVector<char,_false,_false>::clear(&this->exSymbols);
  FastVector<ExternLocalInfo,_false,_false>::clear(&this->exLocals);
  FastVector<ExternModuleInfo,_false,_false>::clear(&this->exModules);
  FastVector<char,_false,_false>::clear(&this->exSource);
  FastVector<char,_false,_false>::clear(&this->exImportPaths);
  FastVector<char,_false,_false>::clear(&this->exMainModuleName);
  FastVector<RegVmCmd,_false,_false>::clear(&this->exRegVmCode);
  FastVector<ExternSourceInfo,_false,_false>::clear(&this->exRegVmSourceInfo);
  FastVector<unsigned_int,_false,_false>::clear(&this->exRegVmExecCount);
  FastVector<unsigned_int,_false,_false>::clear(&this->exRegVmConstants);
  FastVector<unsigned_char,_false,_false>::clear(&this->exRegVmRegKillInfo);
  memset(&this->exRegVmInstructionExecCount,0,0x400);
  local_14 = 0;
  while( true ) {
    uVar2 = FastVector<RegVmCmd_*,_false,_false>::size(&this->expiredRegVmCode);
    puVar1 = NULLC::dealloc;
    if (uVar2 <= local_14) break;
    ppRVar3 = FastVector<RegVmCmd_*,_false,_false>::operator[](&this->expiredRegVmCode,local_14);
    (*(code *)puVar1)(*ppRVar3);
    local_14 = local_14 + 1;
  }
  FastVector<RegVmCmd_*,_false,_false>::clear(&this->expiredRegVmCode);
  local_18 = 0;
  while( true ) {
    uVar2 = FastVector<unsigned_int_*,_false,_false>::size(&this->expiredRegVmConstants);
    puVar1 = NULLC::dealloc;
    if (uVar2 <= local_18) break;
    ppuVar4 = FastVector<unsigned_int_*,_false,_false>::operator[]
                        (&this->expiredRegVmConstants,local_18);
    (*(code *)puVar1)(*ppuVar4);
    local_18 = local_18 + 1;
  }
  FastVector<unsigned_int_*,_false,_false>::clear(&this->expiredRegVmConstants);
  FastVector<unsigned_int,_false,_false>::clear(&this->regVmJumpTargets);
  this->globalVarSize = 0;
  FastVector<unsigned_int,_false,_false>::clear(&this->typeRemap);
  FastVector<unsigned_int,_false,_false>::clear(&this->funcRemap);
  FastVector<unsigned_int,_false,_false>::clear(&this->moduleRemap);
  HashMap<unsigned_int>::clear(&this->funcMap);
  this->debugOutputIndent = 0;
  NULLC::ClearMemory();
  return;
}

Assistant:

void Linker::CleanCode()
{
	exTypes.clear();
	exTypeExtra.clear();
	exTypeConstants.clear();
	exVariables.clear();
	exFunctions.clear();
	exFunctionExplicitTypeArrayOffsets.clear();
	exFunctionExplicitTypes.clear();
	exSymbols.clear();
	exLocals.clear();
	exModules.clear();
	exSource.clear();
	exImportPaths.clear();
	exMainModuleName.clear();

	exRegVmCode.clear();
	exRegVmSourceInfo.clear();
	exRegVmExecCount.clear();
	exRegVmConstants.clear();
	exRegVmRegKillInfo.clear();
	memset(exRegVmInstructionExecCount.data, 0, sizeof(exRegVmInstructionExecCount));

	for(unsigned i = 0; i < expiredRegVmCode.size(); i++)
		NULLC::dealloc(expiredRegVmCode[i]);
	expiredRegVmCode.clear();

	for(unsigned i = 0; i < expiredRegVmConstants.size(); i++)
		NULLC::dealloc(expiredRegVmConstants[i]);
	expiredRegVmConstants.clear();

#ifdef NULLC_LLVM_SUPPORT
	llvmModuleSizes.clear();
	llvmModuleCodes.clear();

	llvmTypeRemapSizes.clear();
	llvmTypeRemapOffsets.clear();
	llvmTypeRemapValues.clear();

	llvmFuncRemapSizes.clear();
	llvmFuncRemapOffsets.clear();
	llvmFuncRemapValues.clear();
#endif

	regVmJumpTargets.clear();

	globalVarSize = 0;

	typeRemap.clear();
	funcRemap.clear();
	moduleRemap.clear();

	funcMap.clear();

	debugOutputIndent = 0;

	NULLC::ClearMemory();
}